

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc_helper.c
# Opt level: O0

uint32_t compute_all_tadd(CPUSPARCState_conflict2 *env)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t ret;
  CPUSPARCState_conflict2 *env_local;
  
  uVar1 = get_NZ_icc((int32_t)env->cc_dst);
  uVar2 = get_C_add_icc((uint32_t)env->cc_dst,(uint32_t)env->cc_src);
  uVar3 = get_V_add_icc((uint32_t)env->cc_dst,(uint32_t)env->cc_src,(uint32_t)env->cc_src2);
  uVar4 = get_V_tag_icc(env->cc_src,env->cc_src2);
  return uVar4 | uVar3 | uVar2 | uVar1;
}

Assistant:

static uint32_t compute_all_tadd(CPUSPARCState *env)
{
    uint32_t ret;

    ret = get_NZ_icc(CC_DST);
    ret |= get_C_add_icc(CC_DST, CC_SRC);
    ret |= get_V_add_icc(CC_DST, CC_SRC, CC_SRC2);
    ret |= get_V_tag_icc(CC_SRC, CC_SRC2);
    return ret;
}